

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

LengthData __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Value *v)

{
  qreal qVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QStringView s;
  QStringView s_00;
  QStringView s_01;
  LengthData LVar3;
  long lStack_60;
  QStringView local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString();
  local_48.m_size = local_38.size;
  local_48.m_data = local_38.ptr;
  s.m_data = L"px";
  s.m_size = 2;
  bVar2 = QStringView::endsWith(&local_48,s,CaseInsensitive);
  if (bVar2) {
    lStack_60 = 1;
  }
  else {
    s_00.m_data = L"ex";
    s_00.m_size = 2;
    bVar2 = QStringView::endsWith(&local_48,s_00,CaseInsensitive);
    if (bVar2) {
      lStack_60 = 2;
    }
    else {
      s_01.m_data = L"em";
      s_01.m_size = 2;
      bVar2 = QStringView::endsWith(&local_48,s_01,CaseInsensitive);
      if (!bVar2) {
        lStack_60 = (ulong)(v->type == Percentage) << 2;
        goto LAB_0053e6d9;
      }
      lStack_60 = 3;
    }
  }
  local_48.m_size = local_48.m_size + -2;
LAB_0053e6d9:
  qVar1 = (qreal)QStringView::toDouble((bool *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    LVar3._8_8_ = lStack_60;
    LVar3.number = qVar1;
    return LVar3;
  }
  __stack_chk_fail();
}

Assistant:

LengthData ValueExtractor::lengthValue(const Value& v)
{
    const QString str = v.variant.toString();
    QStringView s(str);
    LengthData data;
    data.unit = LengthData::None;
    if (s.endsWith(u"px", Qt::CaseInsensitive))
        data.unit = LengthData::Px;
    else if (s.endsWith(u"ex", Qt::CaseInsensitive))
        data.unit = LengthData::Ex;
    else if (s.endsWith(u"em", Qt::CaseInsensitive))
        data.unit = LengthData::Em;

    if (data.unit != LengthData::None)
        s.chop(2);
    else if (v.type == Value::Percentage)
        data.unit = LengthData::Percent;

    data.number = s.toDouble();
    return data;
}